

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Window * windowFind(Parse *pParse,Window *pList,char *zName)

{
  byte bVar1;
  long lVar2;
  
  if (pList == (Window *)0x0) {
LAB_00190190:
    sqlite3ErrorMsg(pParse,"no such window: %s");
    return (Window *)0x0;
  }
LAB_0019015d:
  lVar2 = 0;
  do {
    bVar1 = pList->zName[lVar2];
    if (bVar1 == zName[lVar2]) {
      if ((ulong)bVar1 == 0) {
        return pList;
      }
    }
    else if (""[bVar1] != ""[(byte)zName[lVar2]]) break;
    lVar2 = lVar2 + 1;
  } while( true );
  pList = pList->pNextWin;
  if (pList == (Window *)0x0) goto LAB_00190190;
  goto LAB_0019015d;
}

Assistant:

static Window *windowFind(Parse *pParse, Window *pList, const char *zName){
  Window *p;
  for(p=pList; p; p=p->pNextWin){
    if( sqlite3StrICmp(p->zName, zName)==0 ) break;
  }
  if( p==0 ){
    sqlite3ErrorMsg(pParse, "no such window: %s", zName);
  }
  return p;
}